

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.h
# Opt level: O0

Sexp * GcHeap::AllocateEof(void)

{
  Sexp *pSVar1;
  Sexp *s;
  
  if (g_heap == (GcHeap *)0x0) {
    __assert_fail("g_heap != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.h"
                  ,0xf3,"static Sexp *GcHeap::AllocateEof()");
  }
  pSVar1 = Allocate(g_heap,false);
  if (pSVar1 != (Sexp *)0x0) {
    pSVar1->kind = END_OF_FILE;
    return pSVar1;
  }
  __assert_fail("s != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.h",
                0xf5,"static Sexp *GcHeap::AllocateEof()");
}

Assistant:

static Sexp *AllocateEof() {
    assert(g_heap != nullptr);
    Sexp *s = g_heap->Allocate(false);
    assert(s != nullptr);
    s->kind = Sexp::Kind::END_OF_FILE;
    return s;
  }